

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::
SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
::grow(SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
       *this,size_t MinSize)

{
  void *pvVar1;
  long *plVar2;
  SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  *__ptr;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar3 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                 ).super_SmallVectorBase.Capacity + 2;
  uVar5 = uVar3 >> 1 | uVar3;
  uVar5 = uVar5 >> 2 | uVar5;
  uVar5 = uVar5 >> 4 | uVar5;
  uVar5 = uVar5 >> 8 | uVar5;
  uVar3 = (uVar3 >> 0x20 | uVar5 >> 0x10 | uVar5) + 1;
  if (uVar3 <= MinSize) {
    uVar3 = MinSize;
  }
  if (0xfffffffe < uVar3) {
    uVar3 = 0xffffffff;
  }
  pvVar4 = malloc(uVar3 * 8);
  if (pvVar4 == (void *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  uVar5 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                 ).super_SmallVectorBase.Size;
  if (uVar5 != 0) {
    pvVar1 = (this->
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             ).super_SmallVectorBase.BeginX;
    lVar6 = 0;
    do {
      *(undefined8 *)((long)pvVar4 + lVar6) = *(undefined8 *)((long)pvVar1 + lVar6);
      *(undefined8 *)((long)pvVar1 + lVar6) = 0;
      lVar6 = lVar6 + 8;
    } while (uVar5 * 8 - lVar6 != 0);
  }
  if (uVar5 != 0) {
    pvVar1 = (this->
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             ).super_SmallVectorBase.BeginX;
    lVar6 = uVar5 << 3;
    do {
      plVar2 = *(long **)((long)pvVar1 + lVar6 + -8);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      *(undefined8 *)((long)pvVar1 + lVar6 + -8) = 0;
      lVar6 = lVar6 + -8;
    } while (lVar6 != 0);
  }
  __ptr = (SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
           *)(this->
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             ).super_SmallVectorBase.BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  ).super_SmallVectorBase.BeginX = pvVar4;
  (this->
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  ).super_SmallVectorBase.Capacity = (uint)uVar3;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}